

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_ref_filtering_sse42
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  UWORD32 UVar17;
  int iVar18;
  int iVar19;
  int in_ECX;
  long lVar20;
  byte *in_RDX;
  UWORD32 in_ESI;
  byte *in_RDI;
  int in_R8D;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i const_value_8x16;
  __m128i src_temp8;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp7;
  __m128i src_temp3;
  __m128i src_temp2;
  __m128i src_temp1;
  WORD32 dc_val;
  WORD32 abs_cond_top_flag;
  WORD32 abs_cond_left_flag;
  WORD32 bi_linear_int_flag;
  UWORD8 au1_flt [257];
  WORD32 four_nt;
  WORD32 i;
  WORD32 filter_flag;
  bool local_89d;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  byte local_7f8;
  undefined1 auStack_7f7 [8];
  undefined1 auStack_7ef [15];
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  int local_6f4;
  int local_6f0;
  uint local_6ec;
  int local_6e8;
  byte *local_6e0;
  UWORD32 local_6d4;
  byte *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined1 *local_698;
  byte *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined1 *local_678;
  byte *local_670;
  undefined1 *local_668;
  byte *local_660;
  byte *local_658;
  undefined1 (*local_650) [16];
  undefined1 (*local_648) [16];
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  byte *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  byte *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  byte *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  byte *local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  byte *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  byte *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  byte *local_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  byte *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  byte *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  byte *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  byte *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  byte *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  byte *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  byte *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  byte *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined2 local_1ea;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_6f4 = in_ESI << 2;
  local_89d = false;
  bVar1 = "\x0e"[in_ECX];
  local_6e8 = in_R8D;
  local_6e0 = in_RDX;
  local_6d4 = in_ESI;
  local_6d0 = in_RDI;
  UVar17 = CTZ(in_ESI);
  local_6ec = (uint)bVar1 & 1 << ((char)UVar17 - 2U & 0x1f);
  if (local_6ec == 0) {
    if (local_6d0 != local_6e0) {
      if (local_6d4 == 4) {
        uVar2 = *(undefined8 *)(local_6d0 + 8);
        *(undefined8 *)local_6e0 = *(undefined8 *)local_6d0;
        *(undefined8 *)(local_6e0 + 8) = uVar2;
        local_6e0[local_6f4] = local_6d0[local_6f4];
      }
      else if (local_6d4 == 8) {
        uVar2 = *(undefined8 *)(local_6d0 + 8);
        uVar3 = *(undefined8 *)(local_6d0 + 0x10);
        uVar4 = *(undefined8 *)(local_6d0 + 0x18);
        *(undefined8 *)local_6e0 = *(undefined8 *)local_6d0;
        *(undefined8 *)(local_6e0 + 8) = uVar2;
        *(undefined8 *)(local_6e0 + 0x10) = uVar3;
        *(undefined8 *)(local_6e0 + 0x18) = uVar4;
        local_6e0[local_6f4] = local_6d0[local_6f4];
      }
      else if (local_6d4 == 0x10) {
        uVar2 = *(undefined8 *)(local_6d0 + 8);
        uVar3 = *(undefined8 *)(local_6d0 + 0x10);
        uVar4 = *(undefined8 *)(local_6d0 + 0x18);
        uVar5 = *(undefined8 *)(local_6d0 + 0x20);
        uVar6 = *(undefined8 *)(local_6d0 + 0x28);
        uVar7 = *(undefined8 *)(local_6d0 + 0x30);
        uVar8 = *(undefined8 *)(local_6d0 + 0x38);
        *(undefined8 *)local_6e0 = *(undefined8 *)local_6d0;
        *(undefined8 *)(local_6e0 + 8) = uVar2;
        *(undefined8 *)(local_6e0 + 0x10) = uVar3;
        *(undefined8 *)(local_6e0 + 0x18) = uVar4;
        *(undefined8 *)(local_6e0 + 0x20) = uVar5;
        *(undefined8 *)(local_6e0 + 0x28) = uVar6;
        *(undefined8 *)(local_6e0 + 0x30) = uVar7;
        *(undefined8 *)(local_6e0 + 0x38) = uVar8;
        local_6e0[local_6f4] = local_6d0[local_6f4];
      }
      else if (local_6d4 == 0x20) {
        uVar2 = *(undefined8 *)(local_6d0 + 8);
        uVar3 = *(undefined8 *)(local_6d0 + 0x10);
        uVar4 = *(undefined8 *)(local_6d0 + 0x18);
        uVar5 = *(undefined8 *)(local_6d0 + 0x20);
        uVar6 = *(undefined8 *)(local_6d0 + 0x28);
        uVar7 = *(undefined8 *)(local_6d0 + 0x30);
        uVar8 = *(undefined8 *)(local_6d0 + 0x38);
        uVar9 = *(undefined8 *)(local_6d0 + 0x40);
        uVar10 = *(undefined8 *)(local_6d0 + 0x48);
        uVar11 = *(undefined8 *)(local_6d0 + 0x50);
        uVar12 = *(undefined8 *)(local_6d0 + 0x58);
        uVar13 = *(undefined8 *)(local_6d0 + 0x60);
        uVar14 = *(undefined8 *)(local_6d0 + 0x68);
        uVar15 = *(undefined8 *)(local_6d0 + 0x70);
        uVar16 = *(undefined8 *)(local_6d0 + 0x78);
        *(undefined8 *)local_6e0 = *(undefined8 *)local_6d0;
        *(undefined8 *)(local_6e0 + 8) = uVar2;
        *(undefined8 *)(local_6e0 + 0x10) = uVar3;
        *(undefined8 *)(local_6e0 + 0x18) = uVar4;
        *(undefined8 *)(local_6e0 + 0x20) = uVar5;
        *(undefined8 *)(local_6e0 + 0x28) = uVar6;
        *(undefined8 *)(local_6e0 + 0x30) = uVar7;
        *(undefined8 *)(local_6e0 + 0x38) = uVar8;
        *(undefined8 *)(local_6e0 + 0x40) = uVar9;
        *(undefined8 *)(local_6e0 + 0x48) = uVar10;
        *(undefined8 *)(local_6e0 + 0x50) = uVar11;
        *(undefined8 *)(local_6e0 + 0x58) = uVar12;
        *(undefined8 *)(local_6e0 + 0x60) = uVar13;
        *(undefined8 *)(local_6e0 + 0x68) = uVar14;
        *(undefined8 *)(local_6e0 + 0x70) = uVar15;
        *(undefined8 *)(local_6e0 + 0x78) = uVar16;
        local_6e0[local_6f4] = local_6d0[local_6f4];
      }
    }
  }
  else {
    if ((local_6e8 == 1) && (local_6d4 == 0x20)) {
      iVar18 = (uint)local_6d0[0x40] + (uint)local_6d0[0x80] + (uint)local_6d0[0x60] * -2;
      if (iVar18 < 1) {
        iVar18 = -iVar18;
      }
      iVar19 = (uint)local_6d0[0x40] + (uint)*local_6d0 + (uint)local_6d0[0x20] * -2;
      if (iVar19 < 1) {
        iVar19 = -iVar19;
      }
      local_89d = iVar19 < 8 && iVar18 < 8;
    }
    local_7f8 = *local_6d0;
    auStack_7f7[(long)(int)(local_6d4 << 2) + -1] = local_6d0[(int)(local_6d4 << 2)];
    if (local_89d) {
      auStack_7f7[(long)(int)(local_6d4 << 1) + -1] = local_6d0[(int)(local_6d4 << 1)];
      for (local_6f0 = 1; SBORROW4(local_6f0,local_6d4 * 2) != (int)(local_6f0 + local_6d4 * -2) < 0
          ; local_6f0 = local_6f0 + 1) {
        auStack_7f7[(long)local_6f0 + -1] =
             (char)((int)((local_6d4 * 2 - local_6f0) * (uint)*local_6d0 +
                          local_6f0 * (uint)local_6d0[(int)(local_6d4 << 1)] + 0x20) >> 6);
      }
      for (local_6f0 = 1; SBORROW4(local_6f0,local_6d4 * 2) != (int)(local_6f0 + local_6d4 * -2) < 0
          ; local_6f0 = local_6f0 + 1) {
        auStack_7f7[(long)(int)(local_6f0 + local_6d4 * 2) + -1] =
             (char)((int)((local_6d4 * 2 - local_6f0) * (uint)local_6d0[(int)(local_6d4 << 1)] +
                          local_6f0 * (uint)local_6d0[(int)(local_6d4 << 2)] + 0x20) >> 6);
      }
    }
    else {
      local_1ea = 2;
      local_2 = 2;
      local_4 = 2;
      local_6 = 2;
      local_8 = 2;
      local_a = 2;
      local_c = 2;
      local_e = 2;
      local_10 = 2;
      local_28 = 0x2000200020002;
      uStack_20 = 0x2000200020002;
      local_7f8 = *local_6d0;
      auStack_7f7[(long)(int)(local_6d4 << 2) + -1] = local_6d0[(int)(local_6d4 << 2)];
      for (local_6f0 = 0; local_6f0 < local_6f4; local_6f0 = local_6f0 + 0x10) {
        local_648 = (undefined1 (*) [16])(local_6d0 + local_6f0);
        local_198 = *local_648;
        auVar21 = pmovzxbw(local_198,*(undefined8 *)*local_648);
        local_1a8 = local_198 >> 8;
        local_1a8._0_8_ = local_198._1_8_;
        auVar22 = pmovzxbw(local_198 >> 8,local_1a8._0_8_);
        local_1b8 = local_198 >> 0x10;
        local_1b8._0_8_ = local_198._2_8_;
        auVar23 = pmovzxbw(local_198 >> 0x10,local_1b8._0_8_);
        local_828 = auVar22._0_8_;
        uStack_820 = auVar22._8_8_;
        local_158 = local_828;
        uStack_150 = uStack_820;
        local_15c = 1;
        auVar22 = psllw(auVar22,ZEXT416(1));
        local_818 = auVar21._0_8_;
        uStack_810 = auVar21._8_8_;
        local_828 = auVar22._0_8_;
        uStack_820 = auVar22._8_8_;
        local_98 = local_818;
        uStack_90 = uStack_810;
        local_a8 = local_828;
        uStack_a0 = uStack_820;
        local_98._0_2_ = auVar21._0_2_;
        local_98._2_2_ = auVar21._2_2_;
        local_98._4_2_ = auVar21._4_2_;
        local_98._6_2_ = auVar21._6_2_;
        uStack_90._0_2_ = auVar21._8_2_;
        uStack_90._2_2_ = auVar21._10_2_;
        uStack_90._4_2_ = auVar21._12_2_;
        uStack_90._6_2_ = auVar21._14_2_;
        local_a8._0_2_ = auVar22._0_2_;
        local_a8._2_2_ = auVar22._2_2_;
        local_a8._4_2_ = auVar22._4_2_;
        local_a8._6_2_ = auVar22._6_2_;
        uStack_a0._0_2_ = auVar22._8_2_;
        uStack_a0._2_2_ = auVar22._10_2_;
        uStack_a0._4_2_ = auVar22._12_2_;
        uStack_a0._6_2_ = auVar22._14_2_;
        local_818._0_4_ =
             CONCAT22(local_98._2_2_ + local_a8._2_2_,(short)local_98 + (short)local_a8);
        local_818._0_6_ = CONCAT24(local_98._4_2_ + local_a8._4_2_,(undefined4)local_818);
        local_818 = CONCAT26(local_98._6_2_ + local_a8._6_2_,(undefined6)local_818);
        uStack_810._0_2_ = (short)uStack_90 + (short)uStack_a0;
        uStack_810._2_2_ = uStack_90._2_2_ + uStack_a0._2_2_;
        uStack_810._4_2_ = uStack_90._4_2_ + uStack_a0._4_2_;
        uStack_810._6_2_ = uStack_90._6_2_ + uStack_a0._6_2_;
        local_838 = auVar23._0_8_;
        uStack_830 = auVar23._8_8_;
        local_b8 = local_818;
        uStack_b0 = uStack_810;
        local_c8 = local_838;
        uStack_c0 = uStack_830;
        local_c8._0_2_ = auVar23._0_2_;
        local_c8._2_2_ = auVar23._2_2_;
        local_c8._4_2_ = auVar23._4_2_;
        local_c8._6_2_ = auVar23._6_2_;
        uStack_c0._0_2_ = auVar23._8_2_;
        uStack_c0._2_2_ = auVar23._10_2_;
        uStack_c0._4_2_ = auVar23._12_2_;
        uStack_c0._6_2_ = auVar23._14_2_;
        local_c8._0_2_ = (short)local_98 + (short)local_a8 + (short)local_c8;
        local_c8._2_2_ = local_98._2_2_ + local_a8._2_2_ + local_c8._2_2_;
        local_c8._4_2_ = local_98._4_2_ + local_a8._4_2_ + local_c8._4_2_;
        local_c8._6_2_ = local_98._6_2_ + local_a8._6_2_ + local_c8._6_2_;
        uStack_c0._0_2_ = (short)uStack_90 + (short)uStack_a0 + (short)uStack_c0;
        uStack_c0._2_2_ = uStack_90._2_2_ + uStack_a0._2_2_ + uStack_c0._2_2_;
        uStack_c0._4_2_ = uStack_90._4_2_ + uStack_a0._4_2_ + uStack_c0._4_2_;
        uStack_c0._6_2_ = uStack_90._6_2_ + uStack_a0._6_2_ + uStack_c0._6_2_;
        local_818._0_4_ = CONCAT22(local_c8._2_2_,(short)local_c8);
        local_818._0_6_ = CONCAT24(local_c8._4_2_,(undefined4)local_818);
        local_818 = CONCAT26(local_c8._6_2_,(undefined6)local_818);
        uStack_810._0_2_ = (short)uStack_c0;
        uStack_810._2_2_ = uStack_c0._2_2_;
        uStack_810._4_2_ = uStack_c0._4_2_;
        uStack_810._6_2_ = uStack_c0._6_2_;
        local_d8 = local_818;
        uStack_d0 = uStack_810;
        local_e8 = 0x2000200020002;
        uStack_e0 = 0x2000200020002;
        local_818._0_4_ = CONCAT22(local_c8._2_2_ + 2,(short)local_c8 + 2);
        local_818._0_6_ = CONCAT24(local_c8._4_2_ + 2,(undefined4)local_818);
        local_818 = CONCAT26(local_c8._6_2_ + 2,(undefined6)local_818);
        uStack_810._0_2_ = (short)uStack_c0 + 2;
        uStack_810._2_2_ = uStack_c0._2_2_ + 2;
        uStack_810._4_2_ = uStack_c0._4_2_ + 2;
        uStack_810._6_2_ = uStack_c0._6_2_ + 2;
        local_58 = local_818;
        uStack_50 = uStack_810;
        local_5c = 2;
        auVar22._8_8_ = uStack_810;
        auVar22._0_8_ = local_818;
        auVar22 = psraw(auVar22,ZEXT416(2));
        local_650 = (undefined1 (*) [16])(local_6d0 + (long)local_6f0 + 8);
        local_1c8 = *local_650;
        auVar21 = pmovzxbw(local_1c8,*(undefined8 *)*local_650);
        local_1d8 = local_1c8 >> 8;
        local_1d8._0_8_ = local_1c8._1_8_;
        auVar23 = pmovzxbw(local_1c8 >> 8,local_1d8._0_8_);
        local_1e8 = local_1c8 >> 0x10;
        local_1e8._0_8_ = local_1c8._2_8_;
        auVar24 = pmovzxbw(local_1c8 >> 0x10,local_1e8._0_8_);
        local_868 = auVar23._0_8_;
        uStack_860 = auVar23._8_8_;
        local_178 = local_868;
        uStack_170 = uStack_860;
        local_17c = 1;
        auVar23 = psllw(auVar23,ZEXT416(1));
        local_858 = auVar21._0_8_;
        uStack_850 = auVar21._8_8_;
        local_868 = auVar23._0_8_;
        uStack_860 = auVar23._8_8_;
        local_f8 = local_858;
        uStack_f0 = uStack_850;
        local_108 = local_868;
        uStack_100 = uStack_860;
        local_f8._0_2_ = auVar21._0_2_;
        local_f8._2_2_ = auVar21._2_2_;
        local_f8._4_2_ = auVar21._4_2_;
        local_f8._6_2_ = auVar21._6_2_;
        uStack_f0._0_2_ = auVar21._8_2_;
        uStack_f0._2_2_ = auVar21._10_2_;
        uStack_f0._4_2_ = auVar21._12_2_;
        uStack_f0._6_2_ = auVar21._14_2_;
        local_108._0_2_ = auVar23._0_2_;
        local_108._2_2_ = auVar23._2_2_;
        local_108._4_2_ = auVar23._4_2_;
        local_108._6_2_ = auVar23._6_2_;
        uStack_100._0_2_ = auVar23._8_2_;
        uStack_100._2_2_ = auVar23._10_2_;
        uStack_100._4_2_ = auVar23._12_2_;
        uStack_100._6_2_ = auVar23._14_2_;
        local_858._0_4_ =
             CONCAT22(local_f8._2_2_ + local_108._2_2_,(short)local_f8 + (short)local_108);
        local_858._0_6_ = CONCAT24(local_f8._4_2_ + local_108._4_2_,(undefined4)local_858);
        local_858 = CONCAT26(local_f8._6_2_ + local_108._6_2_,(undefined6)local_858);
        uStack_850._0_2_ = (short)uStack_f0 + (short)uStack_100;
        uStack_850._2_2_ = uStack_f0._2_2_ + uStack_100._2_2_;
        uStack_850._4_2_ = uStack_f0._4_2_ + uStack_100._4_2_;
        uStack_850._6_2_ = uStack_f0._6_2_ + uStack_100._6_2_;
        local_878 = auVar24._0_8_;
        uStack_870 = auVar24._8_8_;
        local_118 = local_858;
        uStack_110 = uStack_850;
        local_128 = local_878;
        uStack_120 = uStack_870;
        local_128._0_2_ = auVar24._0_2_;
        local_128._2_2_ = auVar24._2_2_;
        local_128._4_2_ = auVar24._4_2_;
        local_128._6_2_ = auVar24._6_2_;
        uStack_120._0_2_ = auVar24._8_2_;
        uStack_120._2_2_ = auVar24._10_2_;
        uStack_120._4_2_ = auVar24._12_2_;
        uStack_120._6_2_ = auVar24._14_2_;
        local_128._0_2_ = (short)local_f8 + (short)local_108 + (short)local_128;
        local_128._2_2_ = local_f8._2_2_ + local_108._2_2_ + local_128._2_2_;
        local_128._4_2_ = local_f8._4_2_ + local_108._4_2_ + local_128._4_2_;
        local_128._6_2_ = local_f8._6_2_ + local_108._6_2_ + local_128._6_2_;
        uStack_120._0_2_ = (short)uStack_f0 + (short)uStack_100 + (short)uStack_120;
        uStack_120._2_2_ = uStack_f0._2_2_ + uStack_100._2_2_ + uStack_120._2_2_;
        uStack_120._4_2_ = uStack_f0._4_2_ + uStack_100._4_2_ + uStack_120._4_2_;
        uStack_120._6_2_ = uStack_f0._6_2_ + uStack_100._6_2_ + uStack_120._6_2_;
        local_858._0_4_ = CONCAT22(local_128._2_2_,(short)local_128);
        local_858._0_6_ = CONCAT24(local_128._4_2_,(undefined4)local_858);
        local_858 = CONCAT26(local_128._6_2_,(undefined6)local_858);
        uStack_850._0_2_ = (short)uStack_120;
        uStack_850._2_2_ = uStack_120._2_2_;
        uStack_850._4_2_ = uStack_120._4_2_;
        uStack_850._6_2_ = uStack_120._6_2_;
        local_138 = local_858;
        uStack_130 = uStack_850;
        local_148 = 0x2000200020002;
        uStack_140 = 0x2000200020002;
        local_858._0_4_ = CONCAT22(local_128._2_2_ + 2,(short)local_128 + 2);
        local_858._0_6_ = CONCAT24(local_128._4_2_ + 2,(undefined4)local_858);
        local_858 = CONCAT26(local_128._6_2_ + 2,(undefined6)local_858);
        uStack_850._0_2_ = (short)uStack_120 + 2;
        uStack_850._2_2_ = uStack_120._2_2_ + 2;
        uStack_850._4_2_ = uStack_120._4_2_ + 2;
        uStack_850._6_2_ = uStack_120._6_2_ + 2;
        local_78 = local_858;
        uStack_70 = uStack_850;
        local_7c = 2;
        auVar21._8_8_ = uStack_850;
        auVar21._0_8_ = local_858;
        auVar21 = psraw(auVar21,ZEXT416(2));
        local_818 = auVar22._0_8_;
        uStack_810 = auVar22._8_8_;
        local_858 = auVar21._0_8_;
        uStack_850 = auVar21._8_8_;
        local_38 = local_818;
        uStack_30 = uStack_810;
        local_48 = local_858;
        uStack_40 = uStack_850;
        local_38._0_2_ = auVar22._0_2_;
        local_38._2_2_ = auVar22._2_2_;
        local_38._4_2_ = auVar22._4_2_;
        local_38._6_2_ = auVar22._6_2_;
        uStack_30._0_2_ = auVar22._8_2_;
        uStack_30._2_2_ = auVar22._10_2_;
        uStack_30._4_2_ = auVar22._12_2_;
        uStack_30._6_2_ = auVar22._14_2_;
        local_48._0_2_ = auVar21._0_2_;
        local_48._2_2_ = auVar21._2_2_;
        local_48._4_2_ = auVar21._4_2_;
        local_48._6_2_ = auVar21._6_2_;
        uStack_40._0_2_ = auVar21._8_2_;
        uStack_40._2_2_ = auVar21._10_2_;
        uStack_40._4_2_ = auVar21._12_2_;
        uStack_40._6_2_ = auVar21._14_2_;
        local_818._0_2_ =
             CONCAT11((0 < local_38._2_2_) * (local_38._2_2_ < 0x100) * auVar22[2] -
                      (0xff < local_38._2_2_),
                      (0 < (short)local_38) * ((short)local_38 < 0x100) * auVar22[0] -
                      (0xff < (short)local_38));
        local_818._0_3_ =
             CONCAT12((0 < local_38._4_2_) * (local_38._4_2_ < 0x100) * auVar22[4] -
                      (0xff < local_38._4_2_),(undefined2)local_818);
        local_818._0_4_ =
             CONCAT13((0 < local_38._6_2_) * (local_38._6_2_ < 0x100) * auVar22[6] -
                      (0xff < local_38._6_2_),(undefined3)local_818);
        local_818._0_5_ =
             CONCAT14((0 < (short)uStack_30) * ((short)uStack_30 < 0x100) * auVar22[8] -
                      (0xff < (short)uStack_30),(undefined4)local_818);
        local_818._0_6_ =
             CONCAT15((0 < uStack_30._2_2_) * (uStack_30._2_2_ < 0x100) * auVar22[10] -
                      (0xff < uStack_30._2_2_),(undefined5)local_818);
        local_818._0_7_ =
             CONCAT16((0 < uStack_30._4_2_) * (uStack_30._4_2_ < 0x100) * auVar22[0xc] -
                      (0xff < uStack_30._4_2_),(undefined6)local_818);
        local_818 = CONCAT17((0 < uStack_30._6_2_) * (uStack_30._6_2_ < 0x100) * auVar22[0xe] -
                             (0xff < uStack_30._6_2_),(undefined7)local_818);
        uStack_810._0_1_ =
             (0 < (short)local_48) * ((short)local_48 < 0x100) * auVar21[0] -
             (0xff < (short)local_48);
        uStack_810._1_1_ =
             (0 < local_48._2_2_) * (local_48._2_2_ < 0x100) * auVar21[2] - (0xff < local_48._2_2_);
        uStack_810._2_1_ =
             (0 < local_48._4_2_) * (local_48._4_2_ < 0x100) * auVar21[4] - (0xff < local_48._4_2_);
        uStack_810._3_1_ =
             (0 < local_48._6_2_) * (local_48._6_2_ < 0x100) * auVar21[6] - (0xff < local_48._6_2_);
        uStack_810._4_1_ =
             (0 < (short)uStack_40) * ((short)uStack_40 < 0x100) * auVar21[8] -
             (0xff < (short)uStack_40);
        uStack_810._5_1_ =
             (0 < uStack_40._2_2_) * (uStack_40._2_2_ < 0x100) * auVar21[10] -
             (0xff < uStack_40._2_2_);
        uStack_810._6_1_ =
             (0 < uStack_40._4_2_) * (uStack_40._4_2_ < 0x100) * auVar21[0xc] -
             (0xff < uStack_40._4_2_);
        uStack_810._7_1_ =
             (0 < uStack_40._6_2_) * (uStack_40._6_2_ < 0x100) * auVar21[0xe] -
             (0xff < uStack_40._6_2_);
        lVar20 = (long)local_6f0;
        local_3d0 = (undefined8 *)(auStack_7f7 + lVar20);
        local_3e8 = local_818;
        uStack_3e0 = uStack_810;
        *(undefined8 *)(auStack_7f7 + lVar20) = local_818;
        *(undefined8 *)(auStack_7ef + lVar20) = uStack_810;
      }
      auStack_7f7[(long)(int)(local_6d4 << 2) + -1] = local_6d0[(int)(local_6d4 << 2)];
    }
    if (local_6d4 == 4) {
      local_658 = &local_7f8;
      local_3f0 = local_6e0;
      local_408 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      uStack_400 = stack0xfffffffffffff810;
      *(ulong *)local_6e0 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      *(undefined8 *)(local_6e0 + 8) = stack0xfffffffffffff810;
      local_6e0[local_6f4] = auStack_7f7[(long)local_6f4 + -1];
    }
    else if (local_6d4 == 8) {
      local_660 = &local_7f8;
      local_668 = auStack_7ef + 7;
      local_410 = local_6e0;
      local_428 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      uStack_420 = stack0xfffffffffffff810;
      *(ulong *)local_6e0 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      *(undefined8 *)(local_6e0 + 8) = stack0xfffffffffffff810;
      local_430 = local_6e0 + 0x10;
      local_448 = auStack_7ef._7_8_;
      uStack_440 = uStack_7e0;
      *(undefined8 *)(local_6e0 + 0x10) = auStack_7ef._7_8_;
      *(undefined8 *)(local_6e0 + 0x18) = uStack_7e0;
      local_6e0[local_6f4] = auStack_7f7[(long)local_6f4 + -1];
    }
    else if (local_6d4 == 0x10) {
      local_670 = &local_7f8;
      local_678 = auStack_7ef + 7;
      local_680 = &local_7d8;
      local_688 = &local_7c8;
      local_450 = local_6e0;
      local_468 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      uStack_460 = stack0xfffffffffffff810;
      *(ulong *)local_6e0 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      *(undefined8 *)(local_6e0 + 8) = stack0xfffffffffffff810;
      local_470 = local_6e0 + 0x10;
      local_488 = auStack_7ef._7_8_;
      uStack_480 = uStack_7e0;
      *(undefined8 *)(local_6e0 + 0x10) = auStack_7ef._7_8_;
      *(undefined8 *)(local_6e0 + 0x18) = uStack_7e0;
      local_490 = local_6e0 + 0x20;
      local_4a8 = local_7d8;
      uStack_4a0 = uStack_7d0;
      *(undefined8 *)(local_6e0 + 0x20) = local_7d8;
      *(undefined8 *)(local_6e0 + 0x28) = uStack_7d0;
      local_4b0 = local_6e0 + 0x30;
      local_4c8 = local_7c8;
      uStack_4c0 = uStack_7c0;
      *(undefined8 *)(local_6e0 + 0x30) = local_7c8;
      *(undefined8 *)(local_6e0 + 0x38) = uStack_7c0;
      local_6e0[local_6f4] = auStack_7f7[(long)local_6f4 + -1];
    }
    else if (local_6d4 == 0x20) {
      local_690 = &local_7f8;
      local_698 = auStack_7ef + 7;
      local_6a0 = &local_7d8;
      local_6a8 = &local_7c8;
      local_6b0 = &local_7b8;
      local_6b8 = &local_7a8;
      local_6c0 = &local_798;
      local_6c8 = &local_788;
      local_4d0 = local_6e0;
      local_4e8 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      uStack_4e0 = stack0xfffffffffffff810;
      *(ulong *)local_6e0 = CONCAT71(auStack_7f7._0_7_,local_7f8);
      *(undefined8 *)(local_6e0 + 8) = stack0xfffffffffffff810;
      local_4f0 = local_6e0 + 0x10;
      local_508 = auStack_7ef._7_8_;
      uStack_500 = uStack_7e0;
      *(undefined8 *)(local_6e0 + 0x10) = auStack_7ef._7_8_;
      *(undefined8 *)(local_6e0 + 0x18) = uStack_7e0;
      local_510 = local_6e0 + 0x20;
      local_528 = local_7d8;
      uStack_520 = uStack_7d0;
      *(undefined8 *)(local_6e0 + 0x20) = local_7d8;
      *(undefined8 *)(local_6e0 + 0x28) = uStack_7d0;
      local_530 = local_6e0 + 0x30;
      local_548 = local_7c8;
      uStack_540 = uStack_7c0;
      *(undefined8 *)(local_6e0 + 0x30) = local_7c8;
      *(undefined8 *)(local_6e0 + 0x38) = uStack_7c0;
      local_550 = local_6e0 + 0x40;
      local_568 = local_7b8;
      uStack_560 = uStack_7b0;
      *(undefined8 *)(local_6e0 + 0x40) = local_7b8;
      *(undefined8 *)(local_6e0 + 0x48) = uStack_7b0;
      local_570 = local_6e0 + 0x50;
      local_588 = local_7a8;
      uStack_580 = uStack_7a0;
      *(undefined8 *)(local_6e0 + 0x50) = local_7a8;
      *(undefined8 *)(local_6e0 + 0x58) = uStack_7a0;
      local_590 = local_6e0 + 0x60;
      local_5a8 = local_798;
      uStack_5a0 = uStack_790;
      *(undefined8 *)(local_6e0 + 0x60) = local_798;
      *(undefined8 *)(local_6e0 + 0x68) = uStack_790;
      local_5b0 = local_6e0 + 0x70;
      local_5c8 = local_788;
      uStack_5c0 = uStack_780;
      *(undefined8 *)(local_6e0 + 0x70) = local_788;
      *(undefined8 *)(local_6e0 + 0x78) = uStack_780;
      local_6e0[local_6f4] = auStack_7f7[(long)local_6f4 + -1];
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering_sse42(UWORD8 *pu1_src,
                                          WORD32 nt,
                                          UWORD8 *pu1_dst,
                                          WORD32 mode,
                                          WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    WORD32 dc_val = 1 << (BIT_DEPTH - 5);
    __m128i src_temp1, src_temp2, src_temp3, src_temp7;
    __m128i src_temp4, src_temp5, src_temp6, src_temp8;

    //WORD32 strong_intra_smoothing_enable_flag  = 1;



    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            if(nt == 4)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                pu1_dst[four_nt] = pu1_src[four_nt];

            }

            else if(nt == 8)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);


                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 16)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 32)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_src + 64));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_src + 80));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_src + 96));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_src + 112));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }

        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (abs(pu1_src[2 * nt] + pu1_src[4 * nt]
                                     - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (abs(pu1_src[2 * nt] + pu1_src[0]
                                      - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;
        }
        else
        {
            __m128i const_value_8x16;

            const_value_8x16 = _mm_set1_epi16(2);

            au1_flt[0] = pu1_src[0];
            au1_flt[4 * nt] = pu1_src[4 * nt];

            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt); i += 16)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src + i));
                src_temp2 = _mm_srli_si128(src_temp1, 1);
                src_temp3 = _mm_srli_si128(src_temp2, 1);

                src_temp1 =  _mm_cvtepu8_epi16(src_temp1);
                src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
                src_temp3 =  _mm_cvtepu8_epi16(src_temp3);

                src_temp2 = _mm_slli_epi16(src_temp2,  1);

                src_temp1 = _mm_add_epi16(src_temp1, src_temp2);
                src_temp1 = _mm_add_epi16(src_temp1, src_temp3);
                src_temp1 = _mm_add_epi16(src_temp1, const_value_8x16);

                src_temp1 = _mm_srai_epi16(src_temp1,  2);

                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 8 + i));
                src_temp5 = _mm_srli_si128(src_temp4, 1);
                src_temp6 = _mm_srli_si128(src_temp5, 1);

                src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
                src_temp5 =  _mm_cvtepu8_epi16(src_temp5);
                src_temp6 =  _mm_cvtepu8_epi16(src_temp6);

                src_temp5 = _mm_slli_epi16(src_temp5,  1);

                src_temp4 = _mm_add_epi16(src_temp4, src_temp5);
                src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
                src_temp4 = _mm_add_epi16(src_temp4, const_value_8x16);

                src_temp4 = _mm_srai_epi16(src_temp4,  2);

                /* converting 16 bit to 8 bit */
                src_temp1 = _mm_packus_epi16(src_temp1, src_temp4);

                _mm_storeu_si128((__m128i *)(au1_flt + 1 + i), src_temp1);
            }
            au1_flt[4 * nt] = pu1_src[4 * nt];
        }

        if(nt == 4)
        {
            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 8)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 16)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

        else if(nt == 32)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            src_temp5 = _mm_loadu_si128((__m128i *)(au1_flt + 64));
            src_temp6 = _mm_loadu_si128((__m128i *)(au1_flt + 80));
            src_temp7 = _mm_loadu_si128((__m128i *)(au1_flt + 96));
            src_temp8 = _mm_loadu_si128((__m128i *)(au1_flt + 112));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

    }
}